

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool wallet::LoadCryptedKey(CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  LegacyDataSPKM *vchPubKey_00;
  long in_FS_OFFSET;
  exception *e;
  bool checksum_valid;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchPrivKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  uint256 checksum;
  CPubKey vchPubKey;
  DataStream *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  char *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  byte local_b9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffec8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00
             ,(char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,
             CONCAT13(in_stack_fffffffffffffeef,
                      CONCAT12(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec)),
             SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffec8);
  DataStream::operator>>
            ((DataStream *)
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             (CPubKey *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  uVar3 = CPubKey::IsValid((CPubKey *)in_stack_fffffffffffffec8);
  if (!(bool)uVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_b9 = 0;
    goto LAB_00b65a4a;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec8);
  DataStream::operator>>
            ((DataStream *)
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  uVar4 = DataStream::eof(in_stack_fffffffffffffec8);
  if ((bool)uVar4) {
LAB_00b65972:
    vchPubKey_00 = CWallet::GetOrCreateLegacyDataSPKM
                             ((CWallet *)
                              CONCAT17(in_stack_fffffffffffffedf,
                                       CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)
                                      ));
    in_stack_fffffffffffffedf =
         LegacyDataSPKM::LoadCryptedKey
                   ((LegacyDataSPKM *)
                    CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeee,
                                            CONCAT24(in_stack_fffffffffffffeec,
                                                     in_stack_fffffffffffffee8))),
                    (CPubKey *)vchPubKey_00,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                    (bool)in_stack_fffffffffffffed7);
    if ((bool)in_stack_fffffffffffffedf) {
      bVar2 = false;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                 (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      local_b9 = 0;
      bVar2 = true;
    }
  }
  else {
    uint256::uint256((uint256 *)in_stack_fffffffffffffec8);
    DataStream::operator>>
              ((DataStream *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
               (uint256 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(uVar3,in_stack_fffffffffffffef8));
    in_stack_fffffffffffffeee =
         ::operator==((base_blob<256U> *)
                      CONCAT17(in_stack_fffffffffffffedf,
                               CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                      (base_blob<256U> *)
                      CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    if (((in_stack_fffffffffffffeee ^ 0xff) & 1) == 0) goto LAB_00b65972;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_b9 = 0;
    bVar2 = true;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  if (!bVar2) {
    local_b9 = 1;
  }
LAB_00b65a4a:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_b9 & 1);
}

Assistant:

bool LoadCryptedKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CPubKey vchPubKey;
        ssKey >> vchPubKey;
        if (!vchPubKey.IsValid())
        {
            strErr = "Error reading wallet database: CPubKey corrupt";
            return false;
        }
        std::vector<unsigned char> vchPrivKey;
        ssValue >> vchPrivKey;

        // Get the checksum and check it
        bool checksum_valid = false;
        if (!ssValue.eof()) {
            uint256 checksum;
            ssValue >> checksum;
            if (!(checksum_valid = Hash(vchPrivKey) == checksum)) {
                strErr = "Error reading wallet database: Encrypted key corrupt";
                return false;
            }
        }

        if (!pwallet->GetOrCreateLegacyDataSPKM()->LoadCryptedKey(vchPubKey, vchPrivKey, checksum_valid))
        {
            strErr = "Error reading wallet database: LegacyDataSPKM::LoadCryptedKey failed";
            return false;
        }
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}